

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O0

void __thiscall qclab::qgates::CX<float>::CX(CX<float> *this)

{
  CX<float> *this_local;
  
  QControlledGate2<float>::QControlledGate2(&this->super_QControlledGate2<float>,0,1);
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016c6b0;
  std::make_unique<qclab::qgates::PauliX<float>,int>((int *)&this->gate_);
  return;
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }